

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O2

void __thiscall cs::process_context::process_context(process_context *this)

{
  allocator local_81;
  string *local_80;
  string *local_78;
  code *local_70 [2];
  code *local_60;
  code *local_58;
  code *local_50 [2];
  code *local_40;
  code *local_38;
  
  (this->is_sigint_raised)._M_base._M_i = false;
  local_78 = &this->version;
  std::__cxx11::string::string((string *)local_78,"3.4.3 Castor fiber(Stable) Build 14",&local_81);
  (this->std_version).type = true;
  (this->std_version).data._int = 0x3364c;
  this->output_precision = 8;
  this->exit_code = 0;
  std::__cxx11::string::string((string *)&this->import_path,".",&local_81);
  this->stack_size = 1000;
  local_80 = &this->import_path;
  stack_type<cs_impl::any,_std::allocator>::stack_type(&this->stack);
  local_50[1] = (code *)0x0;
  local_50[0] = on_process_exit_default_handler;
  local_38 = std::_Function_handler<bool_(void_*),_bool_(*)(void_*)>::_M_invoke;
  local_40 = std::_Function_handler<bool_(void_*),_bool_(*)(void_*)>::_M_manager;
  event_type::event_type(&this->on_process_exit,(listener_type *)local_50);
  std::_Function_base::~_Function_base((_Function_base *)local_50);
  local_70[1] = (code *)0x0;
  local_70[0] = on_process_exit_default_handler;
  local_58 = std::_Function_handler<bool_(void_*),_bool_(*)(void_*)>::_M_invoke;
  local_60 = std::_Function_handler<bool_(void_*),_bool_(*)(void_*)>::_M_manager;
  event_type::event_type(&this->on_process_sigint,(listener_type *)local_70);
  std::_Function_base::~_Function_base((_Function_base *)local_70);
  this->std_eh_callback = std_defalt_exception_handler;
  this->cs_eh_callback = cs_defalt_exception_handler;
  LOCK();
  (this->is_sigint_raised)._M_base._M_i = false;
  UNLOCK();
  return;
}

Assistant:

process_context() : on_process_exit(&on_process_exit_default_handler), on_process_sigint(&on_process_exit_default_handler)
		{
			is_sigint_raised = false;
		}